

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O0

float Scl_LibLookup(SC_Surface *p,float slew,float load)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  Vec_Flt_t *pVVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  Vec_Flt_t *vTemp;
  int l;
  int s;
  float p1;
  float p0;
  float lfrac;
  float sfrac;
  float *pDataS1;
  float *pDataS;
  float *pIndex1;
  float *pIndex0;
  float load_local;
  float slew_local;
  SC_Surface *p_local;
  
  iVar4 = Vec_FltSize(&p->vIndex0);
  if ((iVar4 == 1) && (iVar4 = Vec_FltSize(&p->vIndex1), iVar4 == 1)) {
    pVVar6 = (Vec_Flt_t *)Vec_PtrEntry(&p->vData,0);
    iVar4 = Vec_PtrSize(&p->vData);
    if (iVar4 != 1) {
      __assert_fail("Vec_PtrSize(&p->vData) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                    ,0x1e9,"float Scl_LibLookup(SC_Surface *, float, float)");
    }
    iVar4 = Vec_FltSize(pVVar6);
    if (iVar4 != 1) {
      __assert_fail("Vec_FltSize(vTemp) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                    ,0x1ea,"float Scl_LibLookup(SC_Surface *, float, float)");
    }
    p_local._4_4_ = Vec_FltEntry(pVVar6,0);
  }
  else {
    pfVar7 = Vec_FltArray(&p->vIndex0);
    for (vTemp._4_4_ = 1;
        (iVar4 = Vec_FltSize(&p->vIndex0), vTemp._4_4_ < iVar4 + -1 && (pfVar7[vTemp._4_4_] <= slew)
        ); vTemp._4_4_ = vTemp._4_4_ + 1) {
    }
    iVar4 = vTemp._4_4_ + -1;
    pfVar8 = Vec_FltArray(&p->vIndex1);
    for (vTemp._0_4_ = 1;
        (iVar5 = Vec_FltSize(&p->vIndex1), (int)vTemp < iVar5 + -1 && (pfVar8[(int)vTemp] <= load));
        vTemp._0_4_ = (int)vTemp + 1) {
    }
    iVar5 = (int)vTemp + -1;
    fVar1 = pfVar7[iVar4];
    fVar2 = pfVar7[vTemp._4_4_];
    fVar3 = pfVar7[iVar4];
    fVar9 = (load - pfVar8[iVar5]) / (pfVar8[(int)vTemp] - pfVar8[iVar5]);
    pVVar6 = (Vec_Flt_t *)Vec_PtrEntry(&p->vData,iVar4);
    pfVar7 = Vec_FltArray(pVVar6);
    pVVar6 = (Vec_Flt_t *)Vec_PtrEntry(&p->vData,vTemp._4_4_);
    pfVar8 = Vec_FltArray(pVVar6);
    fVar10 = fVar9 * (pfVar7[(int)vTemp] - pfVar7[iVar5]) + pfVar7[iVar5];
    p_local._4_4_ =
         ((slew - fVar1) / (fVar2 - fVar3)) *
         ((fVar9 * (pfVar8[(int)vTemp] - pfVar8[iVar5]) + pfVar8[iVar5]) - fVar10) + fVar10;
  }
  return p_local._4_4_;
}

Assistant:

static inline float Scl_LibLookup( SC_Surface * p, float slew, float load )
{
    float * pIndex0, * pIndex1, * pDataS, * pDataS1;
    float sfrac, lfrac, p0, p1;
    int s, l;

    // handle constant table
    if ( Vec_FltSize(&p->vIndex0) == 1 && Vec_FltSize(&p->vIndex1) == 1 )
    {
        Vec_Flt_t * vTemp = (Vec_Flt_t *)Vec_PtrEntry(&p->vData, 0);
        assert( Vec_PtrSize(&p->vData) == 1 );
        assert( Vec_FltSize(vTemp) == 1 );
        return Vec_FltEntry(vTemp, 0);
    }

    // Find closest sample points in surface:
    pIndex0 = Vec_FltArray(&p->vIndex0);
    for ( s = 1; s < Vec_FltSize(&p->vIndex0)-1; s++ )
        if ( pIndex0[s] > slew )
            break;
    s--;

    pIndex1 = Vec_FltArray(&p->vIndex1);
    for ( l = 1; l < Vec_FltSize(&p->vIndex1)-1; l++ )
        if ( pIndex1[l] > load )
            break;
    l--;

    // Interpolate (or extrapolate) function value from sample points:
    sfrac = (slew - pIndex0[s]) / (pIndex0[s+1] - pIndex0[s]);
    lfrac = (load - pIndex1[l]) / (pIndex1[l+1] - pIndex1[l]);

    pDataS  = Vec_FltArray( (Vec_Flt_t *)Vec_PtrEntry(&p->vData, s) );
    pDataS1 = Vec_FltArray( (Vec_Flt_t *)Vec_PtrEntry(&p->vData, s+1) );

    p0 = pDataS [l] + lfrac * (pDataS [l+1] - pDataS [l]);
    p1 = pDataS1[l] + lfrac * (pDataS1[l+1] - pDataS1[l]);

    return p0 + sfrac * (p1 - p0);      // <<== multiply result with K factor here 
}